

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  Unique<vk::Handle<(vk::HandleType)14>_> *pUVar2;
  PlatformInterface *pPVar3;
  char *pcVar4;
  bool bVar5;
  pointer pHVar6;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  MessageBuilder *this;
  long lVar9;
  Parameters *extraout_RDX;
  char **value;
  Resources *this_00;
  VkResult *in_R9;
  long lVar10;
  VkResult result;
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> handles;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  Environment objEnv;
  pointer local_268;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  Resources res;
  
  std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
  vector(&handles,4,(allocator_type *)&res);
  result = VK_NOT_READY;
  lVar10 = 0;
  do {
    pHVar6 = handles.
             super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar10 == 5) {
      std::
      _Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ::~_Vector_base(&handles.
                       super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                     );
LAB_00468dc5:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"Ok",(allocator<char> *)&recorder);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&res);
LAB_00468df5:
      std::__cxx11::string::~string((string *)&res);
      return __return_storage_ptr__;
    }
    for (; pHVar6 < handles.
                    super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pHVar6 = pHVar6 + 1) {
      pHVar6->m_internal = 0xdededededededede;
    }
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&objAllocator,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&recorder,&objAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,
               0x80);
    pPVar3 = context->m_platformInterface;
    pDVar7 = Context::getDeviceInterface(context);
    pVVar8 = Context::getDevice(context);
    objEnv.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
    objEnv.programBinaries = context->m_progCollection;
    objEnv.allocationCallbacks =
         &recorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    objEnv.maxResourceConsumers = 4;
    res.vertexShader.resources.binary = (ProgramBinary *)context->m_testCtx->m_log;
    pUVar2 = &res.vertexShader.object;
    objEnv.vkp = pPVar3;
    objEnv.vkd = pDVar7;
    objEnv.device = pVVar8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pUVar2);
    std::operator<<((ostream *)pUVar2,"Trying to create ");
    this = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&res,
                      &allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
                       ::numObjects);
    poVar1 = &this->m_str;
    std::operator<<((ostream *)poVar1," objects with ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," allocation");
    pcVar4 = "%s<%s";
    if (lVar10 == 1) {
      pcVar4 = ",\n\t\t";
    }
    std::operator<<((ostream *)poVar1,pcVar4 + 4);
    std::operator<<((ostream *)poVar1," passing");
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pUVar2);
    GraphicsPipeline::Resources::Resources(&res,&objEnv,extraout_RDX);
    ::vk::DeterministicFailAllocator::reset(&objAllocator,MODE_COUNT_AND_FAIL,(deUint32)lVar10);
    GraphicsPipeline::createMultiple
              (&scopedHandles,&objEnv,&res,(Parameters *)&handles,
               (vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                *)&result,in_R9);
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&scopedHandles);
    GraphicsPipeline::Resources::~Resources(&res);
    lVar9 = lVar10;
    if (result == VK_SUCCESS) {
      res.vertexShader.resources.binary = (ProgramBinary *)context->m_testCtx->m_log;
      pUVar2 = &res.vertexShader.object;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pUVar2);
      std::operator<<((ostream *)pUVar2,"Construction of all objects succeeded! ");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pUVar2);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
      ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
      std::
      _Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ::~_Vector_base(&handles.
                       super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                     );
      if (lVar10 != 0) goto LAB_00468dc5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"Allocation callbacks not called",(allocator<char> *)&recorder);
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,(string *)&res);
      goto LAB_00468df5;
    }
    while (lVar9 != 4) {
      pHVar6 = handles.
               super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar9;
      lVar9 = lVar9 + 1;
      if (pHVar6->m_internal != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&res,"Some object handles weren\'t set to NULL",
                   (allocator<char> *)&scopedHandles);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
        goto LAB_00468d00;
      }
    }
    if (result != VK_ERROR_OUT_OF_HOST_MEMORY) {
      local_268 = (pointer)::vk::getResultName(result);
      de::toString<char_const*>((string *)&scopedHandles,(de *)&local_268,value);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     "Got invalid error code: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scopedHandles);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
      std::__cxx11::string::~string((string *)&res);
      this_00 = (Resources *)&scopedHandles;
LAB_00468d08:
      std::__cxx11::string::~string((string *)this_00);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
      ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
      std::
      _Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ::~_Vector_base(&handles.
                       super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                     );
      return __return_storage_ptr__;
    }
    bVar5 = ::vk::validateAndLog(context->m_testCtx->m_log,&recorder,0);
    if (!bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&res,"Invalid allocation callback",(allocator<char> *)&scopedHandles);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&res);
LAB_00468d00:
      this_00 = &res;
      goto LAB_00468d08;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recorder);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&objAllocator);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}